

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF.cc
# Opt level: O0

void __thiscall
QPDF::reserveObjects(QPDF *this,QPDFObjectHandle *foreign,ObjCopier *obj_copier,bool top)

{
  bool bVar1;
  qpdf_object_type_e qVar2;
  logic_error *this_00;
  size_type sVar3;
  mapped_type *pmVar4;
  QPDFObjGen og;
  QPDFObjectHandle local_100;
  QPDFObjectHandle local_f0;
  reference local_e0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  *item_1;
  iterator __end3;
  iterator __begin3;
  Dictionary *__range3;
  reference local_a0;
  QPDFObjectHandle *item;
  iterator __end2;
  iterator __begin2;
  Array *__range2;
  QPDFObjectHandle local_60;
  QPDFObjGen local_4c;
  QPDFObjGen local_44;
  QPDFObjGen local_3c;
  QPDFObjGen foreign_og;
  qpdf_object_type_e foreign_tc;
  bool top_local;
  ObjCopier *obj_copier_local;
  QPDFObjectHandle *foreign_local;
  QPDF *this_local;
  
  qVar2 = QPDFObjectHandle::getTypeCode(foreign);
  if (qVar2 == ot_reserved) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_00,"QPDF: attempting to copy a foreign reserved object");
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar1 = QPDFObjectHandle::isPagesObject(foreign);
  if (bVar1) {
    QTC::TC("qpdf","QPDF not copying pages object",0);
    return;
  }
  bVar1 = QPDFObjectHandle::isIndirect(foreign);
  if (bVar1) {
    local_44 = QPDFObjectHandle::getObjGen(foreign);
    local_3c = local_44;
    bVar1 = QPDFObjGen::set::add(&obj_copier->visiting,local_44);
    if (!bVar1) {
      QTC::TC("qpdf","QPDF loop reserving objects",0);
      return;
    }
    sVar3 = std::
            map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
            ::count(&obj_copier->object_map,&local_3c);
    if (sVar3 == 0) {
      QTC::TC("qpdf","QPDF copy indirect",0);
      bVar1 = QPDFObjectHandle::isStream(foreign);
      if (bVar1) {
        newStream((QPDF *)&local_60);
      }
      else {
        newIndirectNull((QPDF *)&local_60);
      }
      pmVar4 = std::
               map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
               ::operator[](&obj_copier->object_map,&local_3c);
      QPDFObjectHandle::operator=(pmVar4,&local_60);
      QPDFObjectHandle::~QPDFObjectHandle(&local_60);
      if ((!top) && (bVar1 = QPDFObjectHandle::isPageObject(foreign), bVar1)) {
        QTC::TC("qpdf","QPDF not crossing page boundary",0);
        QPDFObjGen::set::erase(&obj_copier->visiting,local_3c);
        return;
      }
    }
    else {
      QTC::TC("qpdf","QPDF already reserved object",0);
      if ((!top) || (bVar1 = QPDFObjectHandle::isPageObject(foreign), !bVar1)) {
LAB_0015f9a5:
        local_4c = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&foreign->super_BaseHandle);
        QPDFObjGen::set::erase(&obj_copier->visiting,local_4c);
        return;
      }
      pmVar4 = std::
               map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
               ::operator[](&obj_copier->object_map,&local_3c);
      bVar1 = QPDFObjectHandle::isNull(pmVar4);
      if (!bVar1) goto LAB_0015f9a5;
    }
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::push_back
              (&obj_copier->to_copy,foreign);
  }
  if (qVar2 == ot_array) {
    QTC::TC("qpdf","QPDF reserve array",0);
    QPDFObjectHandle::as_array((Array *)&__begin2,foreign,any);
    __end2 = ::qpdf::Array::begin((Array *)&__begin2);
    item = (QPDFObjectHandle *)::qpdf::Array::end((Array *)&__begin2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                                       *)&item), bVar1) {
      local_a0 = __gnu_cxx::
                 __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
                 ::operator*(&__end2);
      QPDFObjectHandle::QPDFObjectHandle((QPDFObjectHandle *)&__range3,local_a0);
      reserveObjects(this,(QPDFObjectHandle *)&__range3,obj_copier,false);
      QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)&__range3);
      __gnu_cxx::
      __normal_iterator<QPDFObjectHandle_*,_std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>_>
      ::operator++(&__end2);
    }
    ::qpdf::Array::~Array((Array *)&__begin2);
  }
  else if (qVar2 == ot_dictionary) {
    QTC::TC("qpdf","QPDF reserve dictionary",0);
    QPDFObjectHandle::as_dictionary((QPDFObjectHandle *)&__begin3,(typed)foreign);
    __end3 = ::qpdf::BaseDictionary::begin_abi_cxx11_((BaseDictionary *)&__begin3);
    item_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
              *)::qpdf::BaseDictionary::end_abi_cxx11_((BaseDictionary *)&__begin3);
    while (bVar1 = std::operator!=(&__end3,(_Self *)&item_1), bVar1) {
      local_e0 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
                 ::operator*(&__end3);
      bVar1 = ::qpdf::BaseHandle::null(&(local_e0->second).super_BaseHandle);
      if (!bVar1) {
        QPDFObjectHandle::QPDFObjectHandle(&local_f0,&local_e0->second);
        reserveObjects(this,&local_f0,obj_copier,false);
        QPDFObjectHandle::~QPDFObjectHandle(&local_f0);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
      ::operator++(&__end3);
    }
    ::qpdf::Dictionary::~Dictionary((Dictionary *)&__begin3);
  }
  else if (qVar2 == ot_stream) {
    QTC::TC("qpdf","QPDF reserve stream",0);
    QPDFObjectHandle::getDict(&local_100);
    reserveObjects(this,&local_100,obj_copier,false);
    QPDFObjectHandle::~QPDFObjectHandle(&local_100);
  }
  og = ::qpdf::BaseHandle::operator_cast_to_QPDFObjGen(&foreign->super_BaseHandle);
  QPDFObjGen::set::erase(&obj_copier->visiting,og);
  return;
}

Assistant:

void
QPDF::reserveObjects(QPDFObjectHandle foreign, ObjCopier& obj_copier, bool top)
{
    auto foreign_tc = foreign.getTypeCode();
    if (foreign_tc == ::ot_reserved) {
        throw std::logic_error("QPDF: attempting to copy a foreign reserved object");
    }

    if (foreign.isPagesObject()) {
        QTC::TC("qpdf", "QPDF not copying pages object");
        return;
    }

    if (foreign.isIndirect()) {
        QPDFObjGen foreign_og(foreign.getObjGen());
        if (!obj_copier.visiting.add(foreign_og)) {
            QTC::TC("qpdf", "QPDF loop reserving objects");
            return;
        }
        if (obj_copier.object_map.count(foreign_og) > 0) {
            QTC::TC("qpdf", "QPDF already reserved object");
            if (!(top && foreign.isPageObject() && obj_copier.object_map[foreign_og].isNull())) {
                obj_copier.visiting.erase(foreign);
                return;
            }
        } else {
            QTC::TC("qpdf", "QPDF copy indirect");
            obj_copier.object_map[foreign_og] =
                foreign.isStream() ? newStream() : newIndirectNull();
            if ((!top) && foreign.isPageObject()) {
                QTC::TC("qpdf", "QPDF not crossing page boundary");
                obj_copier.visiting.erase(foreign_og);
                return;
            }
        }
        obj_copier.to_copy.push_back(foreign);
    }

    if (foreign_tc == ::ot_array) {
        QTC::TC("qpdf", "QPDF reserve array");
        for (auto const& item: foreign.as_array()) {
            reserveObjects(item, obj_copier, false);
        }
    } else if (foreign_tc == ::ot_dictionary) {
        QTC::TC("qpdf", "QPDF reserve dictionary");
        for (auto const& item: foreign.as_dictionary()) {
            if (!item.second.null()) {
                reserveObjects(item.second, obj_copier, false);
            }
        }
    } else if (foreign_tc == ::ot_stream) {
        QTC::TC("qpdf", "QPDF reserve stream");
        reserveObjects(foreign.getDict(), obj_copier, false);
    }

    obj_copier.visiting.erase(foreign);
}